

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O3

void __thiscall
Assimp::ObjFileMtlImporter::getTextureOption
          (ObjFileMtlImporter *this,bool *clamp,int *clampIndex,aiString **out)

{
  byte bVar1;
  int i;
  int iVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *__s1;
  char value_1 [3];
  char value [12];
  byte local_5b [3];
  bool *local_58;
  int *local_50;
  aiString **local_48;
  byte local_3c [12];
  
  __s1 = (byte *)(this->m_DataIt)._M_current;
  pbVar6 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar5 = pbVar6 + -1;
  if (pbVar5 != __s1 && __s1 != pbVar6) {
    do {
      if (((ulong)*__s1 < 0x21) && ((0x100003601U >> ((ulong)*__s1 & 0x3f) & 1) != 0))
      goto LAB_00682654;
      __s1 = __s1 + 1;
    } while ((__s1 != pbVar6) && (__s1 != pbVar5));
  }
LAB_00682662:
  (this->m_DataIt)._M_current = (char *)__s1;
  local_58 = clamp;
  local_50 = clampIndex;
  local_48 = out;
  if (pbVar5 == __s1 || __s1 == pbVar6) {
    return;
  }
LAB_00682690:
  if (*__s1 != 0x2d) {
    return;
  }
  if (ClampOption_abi_cxx11_ == (char *)0x0) {
LAB_00682be3:
    __assert_fail("__null != s2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                  ,0xbb,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)");
  }
  if (((ulong)DAT_008cfd00 == 0) ||
     (iVar2 = strncasecmp((char *)__s1,ClampOption_abi_cxx11_,(ulong)DAT_008cfd00), iVar2 == 0)) {
    do {
      if (((ulong)*__s1 < 0x21) && ((0x100003601U >> ((ulong)*__s1 & 0x3f) & 1) != 0))
      goto LAB_006828ee;
      __s1 = __s1 + 1;
    } while ((__s1 != pbVar6) && (__s1 != pbVar5));
    goto LAB_00682909;
  }
  if (TypeOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
  if (((ulong)DAT_008cfd60 == 0) ||
     (iVar2 = strncasecmp((char *)__s1,TypeOption_abi_cxx11_,(ulong)DAT_008cfd60), iVar2 == 0)) {
    do {
      if (((ulong)*__s1 < 0x21) && ((0x100003601U >> ((ulong)*__s1 & 0x3f) & 1) != 0))
      goto LAB_00682993;
      __s1 = __s1 + 1;
    } while ((__s1 != pbVar6) && (__s1 != pbVar5));
    goto LAB_006829ae;
  }
  if (BlendUOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
  iVar2 = 2;
  if (((ulong)DAT_008cfc00 != 0) &&
     (iVar3 = strncasecmp((char *)__s1,BlendUOption_abi_cxx11_,(ulong)DAT_008cfc00), iVar3 != 0)) {
    if (BlendVOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
    if (((ulong)DAT_008cfc20 != 0) &&
       (iVar3 = strncasecmp((char *)__s1,BlendVOption_abi_cxx11_,(ulong)DAT_008cfc20), iVar3 != 0))
    {
      if (BoostOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
      if (((ulong)DAT_008cfc40 != 0) &&
         (iVar3 = strncasecmp((char *)__s1,BoostOption_abi_cxx11_,(ulong)DAT_008cfc40), iVar3 != 0))
      {
        if (ResolutionOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
        if (((ulong)DAT_008cfce0 != 0) &&
           (iVar3 = strncasecmp((char *)__s1,ResolutionOption_abi_cxx11_,(ulong)DAT_008cfce0),
           iVar3 != 0)) {
          if (BumpOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
          if (((ulong)DAT_008cfd20 != 0) &&
             (iVar3 = strncasecmp((char *)__s1,BumpOption_abi_cxx11_,(ulong)DAT_008cfd20),
             iVar3 != 0)) {
            if (ChannelOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
            if (((ulong)DAT_008cfd40 != 0) &&
               (iVar3 = strncasecmp((char *)__s1,ChannelOption_abi_cxx11_,(ulong)DAT_008cfd40),
               iVar3 != 0)) {
              if (ModifyMapOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
              iVar2 = 3;
              if (((ulong)DAT_008cfc60 != 0) &&
                 (iVar3 = strncasecmp((char *)__s1,ModifyMapOption_abi_cxx11_,(ulong)DAT_008cfc60),
                 iVar3 != 0)) {
                if (OffsetOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
                if (((ulong)DAT_008cfc80 != 0) &&
                   (iVar2 = strncasecmp((char *)__s1,OffsetOption_abi_cxx11_,(ulong)DAT_008cfc80),
                   iVar2 != 0)) {
                  if (ScaleOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
                  if (((ulong)DAT_008cfca0 != 0) &&
                     (iVar2 = strncasecmp((char *)__s1,ScaleOption_abi_cxx11_,(ulong)DAT_008cfca0),
                     iVar2 != 0)) {
                    if (TurbulenceOption_abi_cxx11_ == (char *)0x0) goto LAB_00682be3;
                    if ((ulong)DAT_008cfcc0 != 0) {
                      iVar3 = strncasecmp((char *)__s1,TurbulenceOption_abi_cxx11_,
                                          (ulong)DAT_008cfcc0);
                      iVar2 = 1;
                      if (iVar3 != 0) goto LAB_00682b67;
                    }
                  }
                }
                iVar2 = 4;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_00682b67;
LAB_00682654:
  if ((*__s1 != 0x20) && (*__s1 != 9)) goto LAB_00682662;
  __s1 = __s1 + 1;
  if ((__s1 == pbVar6) || (__s1 == pbVar5)) goto LAB_00682662;
  goto LAB_00682654;
  while (__s1 != pbVar5) {
LAB_006828ee:
    if (((*__s1 != 0x20) && (*__s1 != 9)) || (__s1 = __s1 + 1, __s1 == pbVar6)) break;
  }
LAB_00682909:
  if (pbVar5 != __s1 && __s1 != pbVar6) {
    while ((*__s1 == 0x20 || (*__s1 == 9))) {
      __s1 = __s1 + 1;
      if ((__s1 == pbVar6) || (__s1 == pbVar5)) break;
    }
  }
  lVar4 = 0;
  while( true ) {
    bVar1 = __s1[lVar4];
    if (((((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
        (__s1 + lVar4 == pbVar6)) || (__s1 + lVar4 == pbVar5)) goto LAB_00682a0e;
    local_5b[lVar4] = bVar1;
    if (lVar4 == 1) break;
    lVar4 = lVar4 + 1;
  }
  lVar4 = 2;
LAB_00682a0e:
  local_5b[lVar4] = 0;
  iVar2 = strncasecmp((char *)local_5b,"on",2);
  if (iVar2 == 0) {
    *local_58 = true;
  }
LAB_00682b62:
  iVar2 = 2;
LAB_00682b67:
  __s1 = (byte *)(this->m_DataIt)._M_current;
  pbVar6 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar5 = pbVar6 + -1;
  iVar3 = 0;
  do {
    if (pbVar5 != __s1 && __s1 != pbVar6) {
      do {
        if (((ulong)*__s1 < 0x21) && ((0x100003601U >> ((ulong)*__s1 & 0x3f) & 1) != 0))
        goto LAB_00682ba6;
        __s1 = __s1 + 1;
      } while ((__s1 != pbVar6) && (__s1 != pbVar5));
    }
LAB_00682bc1:
    (this->m_DataIt)._M_current = (char *)__s1;
    iVar3 = iVar3 + 1;
  } while (iVar3 != iVar2);
  if (__s1 == pbVar6) {
    return;
  }
  if (pbVar5 == __s1) {
    return;
  }
  goto LAB_00682690;
  while (__s1 != pbVar5) {
LAB_00682993:
    if (((*__s1 != 0x20) && (*__s1 != 9)) || (__s1 = __s1 + 1, __s1 == pbVar6)) break;
  }
LAB_006829ae:
  if (pbVar5 != __s1 && __s1 != pbVar6) {
    do {
      if (((*__s1 != 0x20) && (*__s1 != 9)) || (__s1 = __s1 + 1, __s1 == pbVar6)) break;
    } while (__s1 != pbVar5);
  }
  lVar4 = 0;
  while( true ) {
    bVar1 = __s1[lVar4];
    if ((((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((__s1 + lVar4 == pbVar6 || (__s1 + lVar4 == pbVar5)))) goto LAB_00682a43;
    local_3c[lVar4] = bVar1;
    if (lVar4 == 10) break;
    lVar4 = lVar4 + 1;
  }
  lVar4 = 0xb;
LAB_00682a43:
  local_3c[lVar4] = 0;
  iVar2 = strncasecmp((char *)local_3c,"cube_top",8);
  lVar4 = 0x1c1c;
  if (iVar2 == 0) {
    iVar2 = 7;
  }
  else {
    iVar2 = strncasecmp((char *)local_3c,"cube_bottom",0xb);
    if (iVar2 == 0) {
      lVar4 = 0x2020;
      iVar2 = 8;
    }
    else {
      iVar2 = strncasecmp((char *)local_3c,"cube_front",10);
      if (iVar2 == 0) {
        lVar4 = 0x2424;
        iVar2 = 9;
      }
      else {
        iVar2 = strncasecmp((char *)local_3c,"cube_back",9);
        if (iVar2 == 0) {
          lVar4 = 0x2828;
          iVar2 = 10;
        }
        else {
          iVar2 = strncasecmp((char *)local_3c,"cube_left",9);
          if (iVar2 == 0) {
            lVar4 = 0x2c2c;
            iVar2 = 0xb;
          }
          else {
            iVar2 = strncasecmp((char *)local_3c,"cube_right",10);
            if (iVar2 == 0) {
              lVar4 = 0x3030;
              iVar2 = 0xc;
            }
            else {
              iVar2 = strncasecmp((char *)local_3c,"sphere",6);
              if (iVar2 != 0) goto LAB_00682b62;
              iVar2 = 6;
            }
          }
        }
      }
    }
  }
  *local_50 = iVar2;
  *local_48 = (aiString *)((this->m_pModel->m_pCurrentMaterial->MaterialName).data + lVar4 + -4);
  goto LAB_00682b62;
LAB_00682ba6:
  if ((*__s1 != 0x20) && (*__s1 != 9)) goto LAB_00682bc1;
  __s1 = __s1 + 1;
  if ((__s1 == pbVar6) || (__s1 == pbVar5)) goto LAB_00682bc1;
  goto LAB_00682ba6;
}

Assistant:

void ObjFileMtlImporter::getTextureOption(bool &clamp, int &clampIndex, aiString *&out) {
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);

    // If there is any more texture option
    while (!isEndOfBuffer(m_DataIt, m_DataItEnd) && *m_DataIt == '-')
    {
        const char *pPtr( &(*m_DataIt) );
        //skip option key and value
        int skipToken = 1;

        if (!ASSIMP_strincmp(pPtr, ClampOption.c_str(), static_cast<unsigned int>(ClampOption.size())))
        {
            DataArrayIt it = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
            char value[3];
            CopyNextWord(it, m_DataItEnd, value, sizeof(value) / sizeof(*value));
            if (!ASSIMP_strincmp(value, "on", 2))
            {
                clamp = true;
            }

            skipToken = 2;
        }
        else if( !ASSIMP_strincmp( pPtr, TypeOption.c_str(), static_cast<unsigned int>(TypeOption.size()) ) )
        {
            DataArrayIt it = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
            char value[ 12 ];
            CopyNextWord( it, m_DataItEnd, value, sizeof( value ) / sizeof( *value ) );
            if( !ASSIMP_strincmp( value, "cube_top", 8 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeTopType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[0];
            }
            else if( !ASSIMP_strincmp( value, "cube_bottom", 11 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeBottomType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[1];
            }
            else if( !ASSIMP_strincmp( value, "cube_front", 10 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeFrontType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[2];
            }
            else if( !ASSIMP_strincmp( value, "cube_back", 9 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeBackType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[3];
            }
            else if( !ASSIMP_strincmp( value, "cube_left", 9 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeLeftType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[4];
            }
            else if( !ASSIMP_strincmp( value, "cube_right", 10 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionCubeRightType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[5];
            }
            else if( !ASSIMP_strincmp( value, "sphere", 6 ) )
            {
                clampIndex = ObjFile::Material::TextureReflectionSphereType;
                out = &m_pModel->m_pCurrentMaterial->textureReflection[0];
            }

            skipToken = 2;
        }
        else if (!ASSIMP_strincmp(pPtr, BlendUOption.c_str(), static_cast<unsigned int>(BlendUOption.size()))
                || !ASSIMP_strincmp(pPtr, BlendVOption.c_str(), static_cast<unsigned int>(BlendVOption.size()))
                || !ASSIMP_strincmp(pPtr, BoostOption.c_str(), static_cast<unsigned int>(BoostOption.size()))
                || !ASSIMP_strincmp(pPtr, ResolutionOption.c_str(), static_cast<unsigned int>(ResolutionOption.size()))
                || !ASSIMP_strincmp(pPtr, BumpOption.c_str(), static_cast<unsigned int>(BumpOption.size()))
                || !ASSIMP_strincmp(pPtr, ChannelOption.c_str(), static_cast<unsigned int>(ChannelOption.size())))
        {
            skipToken = 2;
        }
        else if (!ASSIMP_strincmp(pPtr, ModifyMapOption.c_str(), static_cast<unsigned int>(ModifyMapOption.size())))
        {
            skipToken = 3;
        }
        else if (  !ASSIMP_strincmp(pPtr, OffsetOption.c_str(), static_cast<unsigned int>(OffsetOption.size()))
                || !ASSIMP_strincmp(pPtr, ScaleOption.c_str(), static_cast<unsigned int>(ScaleOption.size()))
                || !ASSIMP_strincmp(pPtr, TurbulenceOption.c_str(), static_cast<unsigned int>(TurbulenceOption.size()))
                )
        {
            skipToken = 4;
        }

        for (int i = 0; i < skipToken; ++i)
        {
            m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
        }
    }
}